

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-json.c
# Opt level: O2

void test_bson_as_json_symbol(void)

{
  char cVar1;
  int iVar2;
  undefined8 uVar3;
  char *pcVar4;
  size_t len;
  
  uVar3 = bson_new();
  cVar1 = bson_append_symbol(uVar3,"symbol",0xffffffffffffffff,"foo",0xffffffff);
  if (cVar1 == '\0') {
    pcVar4 = "bson_append_symbol (b, \"symbol\", -1, \"foo\", -1)";
    uVar3 = 0x239;
  }
  else {
    cVar1 = bson_append_symbol(uVar3,"escaping",0xffffffffffffffff,"\"bar\"",0xffffffff);
    if (cVar1 != '\0') {
      pcVar4 = (char *)bson_as_json(uVar3,&len);
      if (pcVar4 != "{ \"symbol\" : \"foo\", \"escaping\" : \"\\\"bar\\\"\" }") {
        iVar2 = strcmp(pcVar4,"{ \"symbol\" : \"foo\", \"escaping\" : \"\\\"bar\\\"\" }");
        if (iVar2 != 0) {
          fprintf(_stderr,"FAIL\n\nAssert Failure: \"%s\" != \"%s\"\n",pcVar4,
                  "{ \"symbol\" : \"foo\", \"escaping\" : \"\\\"bar\\\"\" }");
          abort();
        }
      }
      bson_free(pcVar4);
      bson_destroy(uVar3);
      return;
    }
    pcVar4 = "bson_append_symbol (b, \"escaping\", -1, \"\\\"bar\\\"\", -1)";
    uVar3 = 0x23a;
  }
  fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
          "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-json.c",
          uVar3,"test_bson_as_json_symbol",pcVar4);
  abort();
}

Assistant:

static void
test_bson_as_json_symbol (void)
{
   bson_t *b;
   char *str;
   size_t len;

   b = bson_new ();
   BSON_ASSERT (bson_append_symbol (b, "symbol", -1, "foo", -1));
   BSON_ASSERT (bson_append_symbol (b, "escaping", -1, "\"bar\"", -1));
   str = bson_as_json (b, &len);

   ASSERT_CMPSTR (str,
                  "{"
                  " \"symbol\" : \"foo\","
                  " \"escaping\" : \"\\\"bar\\\"\" }");

   bson_free (str);
   bson_destroy (b);
}